

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O0

uint32_t __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
hashString32(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this,uint32_t seed
            )

{
  XXH32_hash_t XVar1;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this_00;
  void *in_RDI;
  size_t in_stack_ffffffffffffffd8;
  
  this_00 = (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
            start((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x1332fc);
  stringSliceLength(this_00);
  XVar1 = VELOCYPACK_XXH32(in_RDI,in_stack_ffffffffffffffd8,0);
  return XVar1;
}

Assistant:

inline uint32_t hashString32(uint32_t seed = defaultSeed32) const noexcept {
    return VELOCYPACK_HASH32(
        start(), static_cast<std::size_t>(stringSliceLength()), seed);
  }